

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  headers;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  row;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  row_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  row_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  row_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  row_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  row_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  row_05;
  ConsoleTable table;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  undefined1 *local_840 [2];
  undefined1 local_830 [16];
  undefined1 *local_820 [2];
  undefined1 local_810 [16];
  undefined1 *local_800 [2];
  undefined1 local_7f0 [16];
  undefined1 *local_7e0 [2];
  undefined1 local_7d0 [16];
  string local_7c0;
  string local_7a0;
  ConsoleTable local_780;
  
  local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_860,"Country","");
  local_840[0] = local_830;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"Capital","");
  local_820[0] = local_810;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_820,"Population","");
  local_800[0] = local_7f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"Area","");
  local_7e0[0] = local_7d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7e0,"Currency","");
  headers._M_len = 5;
  headers._M_array = &local_860;
  ConsoleTable::ConsoleTable(&local_780,headers);
  lVar1 = 0;
  do {
    if (local_7d0 + lVar1 != *(undefined1 **)((long)local_7e0 + lVar1)) {
      operator_delete(*(undefined1 **)((long)local_7e0 + lVar1));
    }
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0xa0);
  ConsoleTable::setPadding(&local_780,2);
  ConsoleTable::setStyle(&local_780,0);
  local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_860,"Germany","");
  local_840[0] = local_830;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"Berlin","");
  local_820[0] = local_810;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_820,"82,800,000","");
  local_800[0] = local_7f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"357,168 km2","");
  local_7e0[0] = local_7d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7e0,"Euro","");
  row._M_len = 5;
  row._M_array = &local_860;
  ConsoleTable::operator+=(&local_780,row);
  lVar1 = 0;
  do {
    if (local_7d0 + lVar1 != *(undefined1 **)((long)local_7e0 + lVar1)) {
      operator_delete(*(undefined1 **)((long)local_7e0 + lVar1));
    }
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0xa0);
  local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_860,"France","");
  local_840[0] = local_830;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"Paris","");
  local_820[0] = local_810;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_820,"67,201,000","");
  local_800[0] = local_7f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"640,679 km2 ","");
  local_7e0[0] = local_7d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7e0,"Euro","");
  row_00._M_len = 5;
  row_00._M_array = &local_860;
  ConsoleTable::operator+=(&local_780,row_00);
  lVar1 = 0;
  do {
    if (local_7d0 + lVar1 != *(undefined1 **)((long)local_7e0 + lVar1)) {
      operator_delete(*(undefined1 **)((long)local_7e0 + lVar1));
    }
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0xa0);
  local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_860,"South Korea","");
  local_840[0] = local_830;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"Seoul","");
  local_820[0] = local_810;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_820,"51,446,201","");
  local_800[0] = local_7f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"100,210 km2 ","");
  local_7e0[0] = local_7d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7e0,"South Korean Won","");
  row_01._M_len = 5;
  row_01._M_array = &local_860;
  ConsoleTable::operator+=(&local_780,row_01);
  lVar1 = 0;
  do {
    if (local_7d0 + lVar1 != *(undefined1 **)((long)local_7e0 + lVar1)) {
      operator_delete(*(undefined1 **)((long)local_7e0 + lVar1));
    }
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0xa0);
  local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_860,"Australia","");
  local_840[0] = local_830;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"Canberra","");
  local_820[0] = local_810;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_820,"24,877,800","");
  local_800[0] = local_7f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"7,692,024 km2","");
  local_7e0[0] = local_7d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7e0,"Australian Dollar","");
  row_02._M_len = 5;
  row_02._M_array = &local_860;
  ConsoleTable::operator+=(&local_780,row_02);
  lVar1 = 0;
  do {
    if (local_7d0 + lVar1 != *(undefined1 **)((long)local_7e0 + lVar1)) {
      operator_delete(*(undefined1 **)((long)local_7e0 + lVar1));
    }
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0xa0);
  local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_860,"China","");
  local_840[0] = local_830;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"Beijing","");
  local_820[0] = local_810;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_820,"1,403,500,365","");
  local_800[0] = local_7f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"9,596,961 km2","");
  local_7e0[0] = local_7d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7e0,"Yuan","");
  row_03._M_len = 5;
  row_03._M_array = &local_860;
  ConsoleTable::operator+=(&local_780,row_03);
  lVar1 = 0;
  do {
    if (local_7d0 + lVar1 != *(undefined1 **)((long)local_7e0 + lVar1)) {
      operator_delete(*(undefined1 **)((long)local_7e0 + lVar1));
    }
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0xa0);
  local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_860,"Iceland","");
  local_840[0] = local_830;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"Reykjavik","");
  local_820[0] = local_810;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_820,"348,580","");
  local_800[0] = local_7f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"102,775 km2","");
  local_7e0[0] = local_7d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7e0,"Icelandic Krona","");
  row_04._M_len = 5;
  row_04._M_array = &local_860;
  ConsoleTable::operator+=(&local_780,row_04);
  lVar1 = 0;
  do {
    if (local_7d0 + lVar1 != *(undefined1 **)((long)local_7e0 + lVar1)) {
      operator_delete(*(undefined1 **)((long)local_7e0 + lVar1));
    }
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0xa0);
  local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_860,"Netherlands","");
  local_840[0] = local_830;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"Amsterdam","");
  local_820[0] = local_810;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_820,"17,200,671","");
  local_800[0] = local_7f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"41,543 km2","");
  local_7e0[0] = local_7d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7e0,"Euro","");
  row_05._M_len = 5;
  row_05._M_array = &local_860;
  ConsoleTable::operator+=(&local_780,row_05);
  lVar1 = 0;
  do {
    if (local_7d0 + lVar1 != *(undefined1 **)((long)local_7e0 + lVar1)) {
      operator_delete(*(undefined1 **)((long)local_7e0 + lVar1));
    }
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0xa0);
  local_7a0._M_dataplus._M_p = (pointer)&local_7a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a0,"NEW ENTRY","");
  ConsoleTable::updateRow(&local_780,3,1,&local_7a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
    operator_delete(local_7a0._M_dataplus._M_p);
  }
  local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"NEW HEADER","");
  ConsoleTable::updateHeader(&local_780,2,&local_7c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
    operator_delete(local_7c0._M_dataplus._M_p);
  }
  ConsoleTable::operator-=(&local_780,2);
  ConsoleTable::operator-=(&local_780,1);
  ConsoleTable::operator-=(&local_780,0);
  ConsoleTable::sort(&local_780,true);
  operator<<((ostream *)&std::cout,&local_780);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_780.SPACE_CHARACTER._M_dataplus._M_p != &local_780.SPACE_CHARACTER.field_2) {
    operator_delete(local_780.SPACE_CHARACTER._M_dataplus._M_p);
  }
  ConsoleTable::TableStyle::~TableStyle(&local_780.style);
  ConsoleTable::TableStyle::~TableStyle(&local_780.InvisibleStyle);
  ConsoleTable::TableStyle::~TableStyle(&local_780.DoubleLineStyle);
  ConsoleTable::TableStyle::~TableStyle(&local_780.LineStyle);
  ConsoleTable::TableStyle::~TableStyle(&local_780.BasicStyle);
  if (local_780.widths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_780.widths.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_780.rows);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_780.headers);
  return 0;
}

Assistant:

int main() {

    ConsoleTable table{"Country", "Capital", "Population", "Area", "Currency"};

    table.setPadding(2);
    table.setStyle(0);

    table += {"Germany", "Berlin", "82,800,000", "357,168 km2", "Euro"};
    table += {"France", "Paris", "67,201,000", "640,679 km2 ", "Euro"};
    table += {"South Korea", "Seoul", "51,446,201", "100,210 km2 ", "South Korean Won"};
    table += {"Australia", "Canberra", "24,877,800", "7,692,024 km2", "Australian Dollar"};
    table += {"China", "Beijing", "1,403,500,365", "9,596,961 km2", "Yuan"};
    table += {"Iceland", "Reykjavik", "348,580", "102,775 km2", "Icelandic Krona"};
    table += {"Netherlands", "Amsterdam", "17,200,671", "41,543 km2", "Euro"};

    table.updateRow(3, 1, "NEW ENTRY");
    table.updateHeader(2, "NEW HEADER");

    table -= 2;
    table -= 1;
    table -= 0;
    table.sort(true);

    std::cout << table;

    return 0;
}